

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O2

bool_t xdr_bool(XDR *__xdrs,bool_t *__bp)

{
  int *piVar1;
  xdr_op xVar2;
  _Bool _Var3;
  bool_t bVar4;
  undefined8 in_RAX;
  undefined7 extraout_var;
  uint32_t lv;
  uint32_t local_c;
  
  xVar2 = __xdrs[2].x_op;
  bVar4 = (bool_t)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (xVar2 != XDR_FREE) {
    if (xVar2 == XDR_DECODE) {
      _Var3 = xdr_getuint32((XDR *)__xdrs,&local_c);
      bVar4 = (bool_t)CONCAT71(extraout_var,_Var3);
      if (_Var3) {
        *__bp = (uint)(local_c != 0);
      }
    }
    else if (xVar2 == XDR_ENCODE) {
      piVar1 = *(int **)&__xdrs->x_handy + 1;
      if (__xdrs[1].x_base < piVar1) {
        bVar4 = (**(code **)(*(long *)__xdrs + 8))(__xdrs,*__bp != 0);
        return bVar4;
      }
      **(int **)&__xdrs->x_handy = (uint)(*__bp != 0) << 0x18;
      *(int **)&__xdrs->x_handy = piVar1;
    }
    else {
      bVar4 = 0;
    }
  }
  return bVar4;
}

Assistant:

static inline bool
xdr_bool(XDR *xdrs, bool_t *bp)
{
	switch (xdrs->x_op) {

	case XDR_ENCODE:
		return (xdr_putbool(xdrs, *bp));

	case XDR_DECODE:
		return (xdr_getbool(xdrs, bp));

	case XDR_FREE:
		return (true);
	}
	/* NOTREACHED */
	return (false);
}